

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O3

void __thiscall pybind11::dtype::dtype(dtype *this,buffer_info *info)

{
  handle hVar1;
  dtype descr;
  handle local_30;
  object local_28;
  object local_20;
  object local_18;
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  _dtype_from_pep3118();
  str::str((str *)&local_20,(info->format)._M_dataplus._M_p,(info->format)._M_string_length);
  detail::object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_30,(str *)&local_18);
  dtype((dtype *)&local_28,(object *)&local_30);
  object::~object((object *)&local_30);
  object::~object(&local_20);
  object::~object(&local_18);
  strip_padding((dtype *)&local_30,(ssize_t)&local_28);
  hVar1.m_ptr = local_30.m_ptr;
  local_30.m_ptr = (PyObject *)0x0;
  (this->super_object).super_handle.m_ptr = hVar1.m_ptr;
  object::~object((object *)&local_30);
  object::~object(&local_28);
  return;
}

Assistant:

explicit dtype(const buffer_info &info) {
        dtype descr(_dtype_from_pep3118()(PYBIND11_STR_TYPE(info.format)));
        // If info.itemsize == 0, use the value calculated from the format string
        m_ptr = descr.strip_padding(info.itemsize ? info.itemsize : descr.itemsize()).release().ptr();
    }